

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::set_formatter
          (registry *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  bool bVar1;
  element_type *this_00;
  pointer pfVar2;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_48;
  reference local_40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>
  *l;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *__range2;
  lock_guard<std::mutex> lock;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter_local;
  registry *this_local;
  
  lock._M_device = (mutex_type *)formatter;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2,&this->logger_map_mutex_);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            (&this->formatter_,formatter);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
           ::begin(&this->loggers_);
  l = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>
       *)std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
         ::end(&this->loggers_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
                         *)&l);
    if (!bVar1) break;
    local_40 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
               ::operator*(&__end2);
    this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_40->second);
    pfVar2 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                       (&this->formatter_);
    (*pfVar2->_vptr_formatter[3])(&local_48);
    logger::set_formatter(this_00,&local_48);
    std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
              (&local_48);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
    ::operator++(&__end2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_formatter(std::unique_ptr<formatter> formatter)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    formatter_ = std::move(formatter);
    for (auto &l : loggers_)
    {
        l.second->set_formatter(formatter_->clone());
    }
}